

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateVariableName(ExpressionTranslateContext *ctx,VariableData *variable)

{
  SynIdentifier *pSVar1;
  VariableData *ctx_00;
  bool bVar2;
  InplaceStr local_38;
  InplaceStr local_28;
  VariableData *local_18;
  VariableData *variable_local;
  ExpressionTranslateContext *ctx_local;
  
  pSVar1 = variable->name;
  local_18 = variable;
  variable_local = (VariableData *)ctx;
  InplaceStr::InplaceStr(&local_28,"this");
  bVar2 = InplaceStr::operator==(&pSVar1->name,&local_28);
  if (bVar2) {
    Print((ExpressionTranslateContext *)variable_local,"__context");
  }
  else {
    if (*(local_18->name->name).begin == '$') {
      Print((ExpressionTranslateContext *)variable_local,"__");
      ctx_00 = variable_local;
      InplaceStr::InplaceStr(&local_38,(local_18->name->name).begin + 1,(local_18->name->name).end);
      PrintEscapedName((ExpressionTranslateContext *)ctx_00,local_38);
    }
    else {
      PrintEscapedName((ExpressionTranslateContext *)variable_local,local_18->name->name);
    }
    if ((((local_18->scope != (ScopeData *)variable_local->source[0x205].pos.end) &&
         (local_18->scope->ownerType == (TypeBase *)0x0)) &&
        (local_18->scope->ownerFunction == (FunctionData *)0x0)) &&
       (local_18->scope->ownerNamespace == (NamespaceData *)0x0)) {
      Print((ExpressionTranslateContext *)variable_local,"_%d",(ulong)local_18->uniqueId);
    }
  }
  return;
}

Assistant:

void TranslateVariableName(ExpressionTranslateContext &ctx, VariableData *variable)
{
	if(variable->name->name == InplaceStr("this"))
	{
		Print(ctx, "__context");
	}
	else
	{
		if(*variable->name->name.begin == '$')
		{
			Print(ctx, "__");

			PrintEscapedName(ctx, InplaceStr(variable->name->name.begin + 1, variable->name->name.end));
		}
		else
		{
			PrintEscapedName(ctx, variable->name->name);
		}

		if(variable->scope != ctx.ctx.globalScope && !variable->scope->ownerType && !variable->scope->ownerFunction && !variable->scope->ownerNamespace)
			Print(ctx, "_%d", variable->uniqueId);
	}
}